

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
::Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
        *this)

{
  bool bVar1;
  OUT local_250;
  OUT *local_230;
  OUT *_;
  undefined1 local_170 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  *__range2;
  size_t count;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  *this_local;
  
  __range2 = (IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
              *)0x0;
  begin((iterator *)&__end0.valid,this);
  end((iterator *)local_170,this);
  while( true ) {
    iterator::iterator((iterator *)&_,(iterator *)local_170);
    bVar1 = iterator::operator!=((iterator *)&__end0.valid,(iterator *)&_);
    iterator::~iterator((iterator *)&_);
    if (!bVar1) break;
    iterator::operator*(&local_250,(iterator *)&__end0.valid);
    local_230 = &local_250;
    __range2 = (IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
                *)((long)&(__range2->source).super_IState<linq::IGrouping<bool,_int_&>_>.
                          _vptr_IState + 1);
    IGrouping<bool,_int_&>::~IGrouping(&local_250);
    iterator::operator++((iterator *)&__end0.valid);
  }
  iterator::~iterator((iterator *)local_170);
  iterator::~iterator((iterator *)&__end0.valid);
  return (size_t)__range2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}